

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParserBase::Skip(UDMFParserBase *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  
  if (1 < developer.Value) {
    FScanner::ScriptMessage(&this->sc,"Ignoring unknown UDMF key \"%s\".",(this->sc).String);
  }
  bVar2 = FScanner::CheckToken(&this->sc,0x7b);
  if (bVar2) {
    iVar3 = 1;
    while( true ) {
      bVar2 = FScanner::GetToken(&this->sc);
      if (!bVar2) break;
      iVar1 = (this->sc).TokenType;
      if (iVar1 == 0x7b) {
        iVar3 = iVar3 + 1;
      }
      else if ((iVar1 == 0x7d) && (iVar3 = iVar3 + -1, iVar3 == 0)) {
        FScanner::UnGet(&this->sc);
        return;
      }
    }
  }
  else {
    FScanner::MustGetToken(&this->sc,0x3d);
    do {
      FScanner::MustGetAnyToken(&this->sc);
    } while ((this->sc).TokenType != 0x3b);
  }
  return;
}

Assistant:

void UDMFParserBase::Skip()
{
	if (developer >= DMSG_WARNING) sc.ScriptMessage("Ignoring unknown UDMF key \"%s\".", sc.String);
	if(sc.CheckToken('{'))
	{
		int level = 1;
		while(sc.GetToken())
		{
			if (sc.TokenType == '}')
			{
				level--;
				if(level == 0)
				{
					sc.UnGet();
					break;
				}
			}
			else if (sc.TokenType == '{')
			{
				level++;
			}
		}
	}
	else
	{
		sc.MustGetToken('=');
		do
		{
			sc.MustGetAnyToken();
		}
		while(sc.TokenType != ';');
	}
}